

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O0

void __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestCase::initPrograms
          (GridRenderTestCase *this,SourceCollections *programCollection)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ProgramSources *pPVar5;
  int local_bd4;
  string local_9b8;
  ShaderSource local_998;
  allocator<char> local_969;
  string local_968;
  ostringstream local_948 [8];
  ostringstream src_4;
  int numPrimitives;
  int numInvocations;
  ShaderSource local_7a8;
  allocator<char> local_779;
  string local_778;
  ostringstream local_758 [8];
  ostringstream src_3;
  string local_5e0;
  ShaderSource local_5c0;
  allocator<char> local_591;
  string local_590;
  ostringstream local_570 [8];
  ostringstream src_2;
  string local_3f8;
  ShaderSource local_3d8;
  allocator<char> local_3a9;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream src_1;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  SourceCollections *programCollection_local;
  GridRenderTestCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)local_190,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar4,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vert",&local_1c1);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar5,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_388);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)local_388,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) flat in highp   vec4 v_color;\n");
  poVar4 = std::operator<<(poVar4,"layout(location = 0) out     mediump vec4 fragColor;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"    fragColor = v_color;\n");
  std::operator<<(poVar4,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"frag",&local_3a9);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_3a8);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_3d8,&local_3f8);
  glu::ProgramSources::operator<<(pPVar5,&local_3d8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::ostringstream::~ostringstream(local_388);
  std::__cxx11::ostringstream::ostringstream(local_570);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)local_570,pcVar3);
  poVar4 = std::operator<<(poVar4,
                           "\n#extension GL_EXT_tessellation_shader : require\nlayout(vertices = 1) out;\n\nvoid main (void)\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n    gl_TessLevelInner[0] = float("
                          );
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
  poVar4 = std::operator<<(poVar4,");\n    gl_TessLevelInner[1] = float(");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
  poVar4 = std::operator<<(poVar4,");\n    gl_TessLevelOuter[0] = float(");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
  poVar4 = std::operator<<(poVar4,");\n    gl_TessLevelOuter[1] = float(");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
  poVar4 = std::operator<<(poVar4,");\n    gl_TessLevelOuter[2] = float(");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
  poVar4 = std::operator<<(poVar4,");\n    gl_TessLevelOuter[3] = float(");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
  std::operator<<(poVar4,");\n}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"tesc",&local_591);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_590);
  std::__cxx11::ostringstream::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_5c0,&local_5e0);
  glu::ProgramSources::operator<<(pPVar5,&local_5c0);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::ostringstream::~ostringstream(local_570);
  std::__cxx11::ostringstream::ostringstream(local_758);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)local_758,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"#extension GL_EXT_tessellation_shader : require\n");
  poVar4 = std::operator<<(poVar4,"layout(quads) in;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(location = 0) out mediump ivec2 v_tessellationGridPosition;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "// note: No need to use precise gl_Position since position does not depend on order\n"
                          );
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  std::operator<<(poVar4,"{\n");
  if ((this->m_flags & 0x58) == 0) {
    poVar4 = std::operator<<((ostream *)local_758,"    // Fill the whole viewport\n");
    std::operator<<(poVar4,
                    "    gl_Position = vec4(gl_TessCoord.x * 2.0 - 1.0, gl_TessCoord.y * 2.0 - 1.0, 0.0, 1.0);\n"
                   );
  }
  else {
    poVar4 = std::operator<<((ostream *)local_758,
                             "    // Cover only a small area in a corner. The area will be expanded in geometry shader to cover whole viewport\n"
                            );
    std::operator<<(poVar4,
                    "    gl_Position = vec4(gl_TessCoord.x * 0.3 - 1.0, gl_TessCoord.y * 0.3 - 1.0, 0.0, 1.0);\n"
                   );
  }
  poVar4 = std::operator<<((ostream *)local_758,"    // Calculate position in tessellation grid\n");
  poVar4 = std::operator<<(poVar4,
                           "    v_tessellationGridPosition = ivec2(round(gl_TessCoord.xy * float(");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
  poVar4 = std::operator<<(poVar4,")));\n");
  std::operator<<(poVar4,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"tese",&local_779);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_778);
  std::__cxx11::ostringstream::str();
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_7a8,(string *)&numPrimitives);
  glu::ProgramSources::operator<<(pPVar5,&local_7a8);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_7a8);
  std::__cxx11::string::~string((string *)&numPrimitives);
  std::__cxx11::string::~string((string *)&local_778);
  std::allocator<char>::~allocator(&local_779);
  std::__cxx11::ostringstream::~ostringstream(local_758);
  iVar1 = this->m_numGeometryInvocations;
  iVar2 = this->m_numGeometryPrimitivesPerInvocation;
  std::__cxx11::ostringstream::ostringstream(local_948);
  pcVar3 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar4 = std::operator<<((ostream *)local_948,pcVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"#extension GL_EXT_geometry_shader : require\n");
  poVar4 = std::operator<<(poVar4,"layout(triangles, invocations = ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
  poVar4 = std::operator<<(poVar4,") in;\n");
  poVar4 = std::operator<<(poVar4,"layout(triangle_strip, max_vertices = ");
  if ((this->m_flags & 0x20) == 0) {
    local_bd4 = iVar2 + 2;
  }
  else {
    local_bd4 = iVar2 << 2;
  }
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_bd4);
  poVar4 = std::operator<<(poVar4,") out;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "layout(location = 0) in       mediump ivec2 v_tessellationGridPosition[];\n"
                          );
  poVar4 = std::operator<<(poVar4,"layout(location = 0) flat out highp   vec4  v_color;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"    const float equalThreshold = 0.001;\n");
  poVar4 = std::operator<<(poVar4,
                           "    const float gapOffset = 0.0001; // subdivision performed by the geometry shader might produce gaps. Fill potential gaps by enlarging the output slice a little.\n"
                          );
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,
                           "    // Input triangle is generated from an axis-aligned rectangle by splitting it in half\n"
                          );
  poVar4 = std::operator<<(poVar4,
                           "    // Original rectangle can be found by finding the bounding AABB of the triangle\n"
                          );
  poVar4 = std::operator<<(poVar4,
                           "    vec4 aabb = vec4(min(gl_in[0].gl_Position.x, min(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
                          );
  poVar4 = std::operator<<(poVar4,
                           "                     min(gl_in[0].gl_Position.y, min(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)),\n"
                          );
  poVar4 = std::operator<<(poVar4,
                           "                     max(gl_in[0].gl_Position.x, max(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
                          );
  poVar4 = std::operator<<(poVar4,
                           "                     max(gl_in[0].gl_Position.y, max(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)));\n"
                          );
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"    // Location in tessellation grid\n");
  poVar4 = std::operator<<(poVar4,
                           "    ivec2 gridPosition = ivec2(min(v_tessellationGridPosition[0], min(v_tessellationGridPosition[1], v_tessellationGridPosition[2])));\n"
                          );
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"    // Which triangle of the two that split the grid cell\n");
  poVar4 = std::operator<<(poVar4,"    int numVerticesOnBottomEdge = 0;\n");
  poVar4 = std::operator<<(poVar4,"    for (int ndx = 0; ndx < 3; ++ndx)\n");
  poVar4 = std::operator<<(poVar4,
                           "        if (abs(gl_in[ndx].gl_Position.y - aabb.w) < equalThreshold)\n")
  ;
  poVar4 = std::operator<<(poVar4,"            ++numVerticesOnBottomEdge;\n");
  poVar4 = std::operator<<(poVar4,"    bool isBottomTriangle = numVerticesOnBottomEdge == 2;\n");
  std::operator<<(poVar4,"\n");
  if ((this->m_flags & 0x10) == 0) {
    if ((this->m_flags & 0x40) == 0) {
      if ((this->m_flags & 8) == 0) {
        poVar4 = std::operator<<((ostream *)local_948,"    // Fill the input area with slices\n");
        poVar4 = std::operator<<(poVar4,
                                 "    // Upper triangle produces slices only to the upper half of the quad and vice-versa\n"
                                );
        poVar4 = std::operator<<(poVar4,
                                 "    float triangleOffset = (isBottomTriangle) ? ((aabb.w + aabb.y) / 2.0) : (aabb.y);\n"
                                );
        poVar4 = std::operator<<(poVar4,"    // Each slice is a invocation\n");
        poVar4 = std::operator<<(poVar4,"    float sliceHeight = (aabb.w - aabb.y) / float(2 * ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
        poVar4 = std::operator<<(poVar4,");\n");
        poVar4 = std::operator<<(poVar4,
                                 "    float invocationOffset = float(gl_InvocationID) * sliceHeight;\n"
                                );
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"    vec4 outputSliceArea;\n");
        poVar4 = std::operator<<(poVar4,"    outputSliceArea.x = aabb.x - gapOffset;\n");
        poVar4 = std::operator<<(poVar4,
                                 "    outputSliceArea.y = triangleOffset + invocationOffset - gapOffset;\n"
                                );
        poVar4 = std::operator<<(poVar4,"    outputSliceArea.z = aabb.z + gapOffset;\n");
        std::operator<<(poVar4,
                        "    outputSliceArea.w = triangleOffset + invocationOffset + sliceHeight + gapOffset;\n"
                       );
      }
      else {
        poVar4 = std::operator<<((ostream *)local_948,"    // Scatter slices\n");
        poVar4 = std::operator<<(poVar4,
                                 "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
                                );
        poVar4 = std::operator<<(poVar4,
                                 "    ivec2 srcSliceNdx = ivec2(gridPosition.x, gridPosition.y * ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1 * 2);
        poVar4 = std::operator<<(poVar4," + inputTriangleNdx);\n");
        poVar4 = std::operator<<(poVar4,
                                 "    ivec2 dstSliceNdx = ivec2(7 * srcSliceNdx.x, 127 * srcSliceNdx.y) % ivec2("
                                );
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
        poVar4 = std::operator<<(poVar4," * ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1 * 2);
        poVar4 = std::operator<<(poVar4,");\n");
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"    // Draw slice to the dstSlice slot\n");
        poVar4 = std::operator<<(poVar4,"    vec4 outputSliceArea;\n");
        poVar4 = std::operator<<(poVar4,"    outputSliceArea.x = float(dstSliceNdx.x)   / float(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
        poVar4 = std::operator<<(poVar4,") * 2.0 - 1.0 - gapOffset;\n");
        poVar4 = std::operator<<(poVar4,"    outputSliceArea.y = float(dstSliceNdx.y)   / float(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel * iVar1 * 2);
        poVar4 = std::operator<<(poVar4,") * 2.0 - 1.0 - gapOffset;\n");
        poVar4 = std::operator<<(poVar4,"    outputSliceArea.z = float(dstSliceNdx.x+1) / float(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
        poVar4 = std::operator<<(poVar4,") * 2.0 - 1.0 + gapOffset;\n");
        poVar4 = std::operator<<(poVar4,"    outputSliceArea.w = float(dstSliceNdx.y+1) / float(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel * iVar1 * 2);
        std::operator<<(poVar4,") * 2.0 - 1.0 + gapOffset;\n");
      }
      poVar4 = std::operator<<((ostream *)local_948,"\n");
      poVar4 = std::operator<<(poVar4,"    // Draw slice\n");
      poVar4 = std::operator<<(poVar4,"    for (int ndx = 0; ndx < ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(iVar2 + 2) - (iVar2 + 2 >> 0x1f) >> 1);
      poVar4 = std::operator<<(poVar4,"; ++ndx)\n");
      poVar4 = std::operator<<(poVar4,"    {\n");
      poVar4 = std::operator<<(poVar4,"        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n");
      poVar4 = std::operator<<(poVar4,"        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n");
      poVar4 = std::operator<<(poVar4,
                               "        vec4 outputColor = (((gl_InvocationID + ndx) % 2) == 0) ? (green) : (yellow);\n"
                              );
      poVar4 = std::operator<<(poVar4,
                               "        float xpos = mix(outputSliceArea.x, outputSliceArea.z, float(ndx) / float("
                              );
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2 / 2);
      poVar4 = std::operator<<(poVar4,"));\n");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,
                               "        gl_Position = vec4(xpos, outputSliceArea.y, 0.0, 1.0);\n");
      poVar4 = std::operator<<(poVar4,"        v_color = outputColor;\n");
      poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,
                               "        gl_Position = vec4(xpos, outputSliceArea.w, 0.0, 1.0);\n");
      poVar4 = std::operator<<(poVar4,"        v_color = outputColor;\n");
      poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
      std::operator<<(poVar4,"    }\n");
    }
    else {
      poVar4 = std::operator<<((ostream *)local_948,
                               "    // Draw grid cells, send each primitive to a separate layer\n");
      poVar4 = std::operator<<(poVar4,
                               "    int baseLayer = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
                              );
      poVar4 = std::operator<<(poVar4,"    for (int ndx = 0; ndx < ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,"; ++ndx)\n");
      poVar4 = std::operator<<(poVar4,"    {\n");
      poVar4 = std::operator<<(poVar4,"        ivec2 dstGridSize = ivec2(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
      poVar4 = std::operator<<(poVar4," * ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
      poVar4 = std::operator<<(poVar4,");\n");
      poVar4 = std::operator<<(poVar4,"        ivec2 dstGridNdx = ivec2((gridPosition.x * ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
      poVar4 = std::operator<<(poVar4,
                               " * 7 + ndx)*13, (gridPosition.y * 127 + ndx) * 19) % dstGridSize;\n"
                              );
      poVar4 = std::operator<<(poVar4,"        vec4 dstArea;\n");
      poVar4 = std::operator<<(poVar4,
                               "        dstArea.x = float(dstGridNdx.x) / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
                              );
      poVar4 = std::operator<<(poVar4,
                               "        dstArea.y = float(dstGridNdx.y) / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
                              );
      poVar4 = std::operator<<(poVar4,
                               "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
                              );
      poVar4 = std::operator<<(poVar4,
                               "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
                              );
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n");
      poVar4 = std::operator<<(poVar4,"        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n");
      poVar4 = std::operator<<(poVar4,
                               "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
                              );
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,
                               "        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n");
      poVar4 = std::operator<<(poVar4,"        v_color = outputColor;\n");
      poVar4 = std::operator<<(poVar4,"        gl_Layer = ((baseLayer + ndx) * 11) % ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_numLayers);
      poVar4 = std::operator<<(poVar4,";\n");
      poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,
                               "        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n");
      poVar4 = std::operator<<(poVar4,"        v_color = outputColor;\n");
      poVar4 = std::operator<<(poVar4,"        gl_Layer = ((baseLayer + ndx) * 11) % ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_numLayers);
      poVar4 = std::operator<<(poVar4,";\n");
      poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,
                               "        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n");
      poVar4 = std::operator<<(poVar4,"        v_color = outputColor;\n");
      poVar4 = std::operator<<(poVar4,"        gl_Layer = ((baseLayer + ndx) * 11) % ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_numLayers);
      poVar4 = std::operator<<(poVar4,";\n");
      poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,
                               "        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n");
      poVar4 = std::operator<<(poVar4,"        v_color = outputColor;\n");
      poVar4 = std::operator<<(poVar4,"        gl_Layer = ((baseLayer + ndx) * 11) % ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_numLayers);
      poVar4 = std::operator<<(poVar4,";\n");
      poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
      poVar4 = std::operator<<(poVar4,"        EndPrimitive();\n");
      std::operator<<(poVar4,"    }\n");
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)local_948,"    // Draw grid cells\n");
    poVar4 = std::operator<<(poVar4,
                             "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
                            );
    poVar4 = std::operator<<(poVar4,"    for (int ndx = 0; ndx < ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,"; ++ndx)\n");
    poVar4 = std::operator<<(poVar4,"    {\n");
    poVar4 = std::operator<<(poVar4,"        ivec2 dstGridSize = ivec2(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
    poVar4 = std::operator<<(poVar4," * ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,", 2 * ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
    poVar4 = std::operator<<(poVar4," * ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
    poVar4 = std::operator<<(poVar4,");\n");
    poVar4 = std::operator<<(poVar4,"        ivec2 dstGridNdx = ivec2(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
    poVar4 = std::operator<<(poVar4," * ndx + gridPosition.x, ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->m_tessGenLevel);
    poVar4 = std::operator<<(poVar4,
                             " * inputTriangleNdx + 2 * gridPosition.y + ndx * 127) % dstGridSize;\n"
                            );
    poVar4 = std::operator<<(poVar4,"        vec4 dstArea;\n");
    poVar4 = std::operator<<(poVar4,
                             "        dstArea.x = float(dstGridNdx.x)   / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
                            );
    poVar4 = std::operator<<(poVar4,
                             "        dstArea.y = float(dstGridNdx.y)   / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
                            );
    poVar4 = std::operator<<(poVar4,
                             "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
                            );
    poVar4 = std::operator<<(poVar4,
                             "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
                            );
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,"        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n");
    poVar4 = std::operator<<(poVar4,
                             "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
                            );
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n")
    ;
    poVar4 = std::operator<<(poVar4,"        v_color = outputColor;\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n")
    ;
    poVar4 = std::operator<<(poVar4,"        v_color = outputColor;\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n")
    ;
    poVar4 = std::operator<<(poVar4,"        v_color = outputColor;\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n")
    ;
    poVar4 = std::operator<<(poVar4,"        v_color = outputColor;\n");
    poVar4 = std::operator<<(poVar4,"        EmitVertex();\n");
    poVar4 = std::operator<<(poVar4,"        EndPrimitive();\n");
    std::operator<<(poVar4,"    }\n");
  }
  std::operator<<((ostream *)local_948,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"geom",&local_969);
  pPVar5 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_968);
  std::__cxx11::ostringstream::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_998,&local_9b8);
  glu::ProgramSources::operator<<(pPVar5,&local_998);
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_998);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator(&local_969);
  std::__cxx11::ostringstream::~ostringstream(local_948);
  return;
}

Assistant:

void GridRenderTestCase::initPrograms (SourceCollections& programCollection) const
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "layout(location = 0) flat in highp   vec4 v_color;\n"
			<< "layout(location = 0) out     mediump vec4 fragColor;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    fragColor = v_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}

	// Tessellation control
	{
		std::ostringstream src;
		src <<	glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				"#extension GL_EXT_tessellation_shader : require\n"
				"layout(vertices = 1) out;\n"
				"\n"
				"void main (void)\n"
				"{\n"
				"    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
				"    gl_TessLevelInner[0] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelInner[1] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[0] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[1] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[2] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[3] = float(" << m_tessGenLevel << ");\n"
				"}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "layout(quads) in;\n"
			<< "\n"
			<< "layout(location = 0) out mediump ivec2 v_tessellationGridPosition;\n"
			<< "\n"
			<< "// note: No need to use precise gl_Position since position does not depend on order\n"
			<< "void main (void)\n"
			<< "{\n";

		if (m_flags & (FLAG_GEOMETRY_SCATTER_INSTANCES | FLAG_GEOMETRY_SCATTER_PRIMITIVES | FLAG_GEOMETRY_SCATTER_LAYERS))
			src << "    // Cover only a small area in a corner. The area will be expanded in geometry shader to cover whole viewport\n"
				<< "    gl_Position = vec4(gl_TessCoord.x * 0.3 - 1.0, gl_TessCoord.y * 0.3 - 1.0, 0.0, 1.0);\n";
		else
			src << "    // Fill the whole viewport\n"
				<< "    gl_Position = vec4(gl_TessCoord.x * 2.0 - 1.0, gl_TessCoord.y * 2.0 - 1.0, 0.0, 1.0);\n";

		src << "    // Calculate position in tessellation grid\n"
			<< "    v_tessellationGridPosition = ivec2(round(gl_TessCoord.xy * float(" << m_tessGenLevel << ")));\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	// Geometry shader
	{
		const int numInvocations = m_numGeometryInvocations;
		const int numPrimitives  = m_numGeometryPrimitivesPerInvocation;

		std::ostringstream src;

		src	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "layout(triangles, invocations = " << numInvocations << ") in;\n"
			<< "layout(triangle_strip, max_vertices = " << ((m_flags & FLAG_GEOMETRY_SEPARATE_PRIMITIVES) ? (4 * numPrimitives) : (numPrimitives + 2)) << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in       mediump ivec2 v_tessellationGridPosition[];\n"
			<< "layout(location = 0) flat out highp   vec4  v_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    const float equalThreshold = 0.001;\n"
			<< "    const float gapOffset = 0.0001; // subdivision performed by the geometry shader might produce gaps. Fill potential gaps by enlarging the output slice a little.\n"
			<< "\n"
			<< "    // Input triangle is generated from an axis-aligned rectangle by splitting it in half\n"
			<< "    // Original rectangle can be found by finding the bounding AABB of the triangle\n"
			<< "    vec4 aabb = vec4(min(gl_in[0].gl_Position.x, min(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
			<< "                     min(gl_in[0].gl_Position.y, min(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)),\n"
			<< "                     max(gl_in[0].gl_Position.x, max(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
			<< "                     max(gl_in[0].gl_Position.y, max(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)));\n"
			<< "\n"
			<< "    // Location in tessellation grid\n"
			<< "    ivec2 gridPosition = ivec2(min(v_tessellationGridPosition[0], min(v_tessellationGridPosition[1], v_tessellationGridPosition[2])));\n"
			<< "\n"
			<< "    // Which triangle of the two that split the grid cell\n"
			<< "    int numVerticesOnBottomEdge = 0;\n"
			<< "    for (int ndx = 0; ndx < 3; ++ndx)\n"
			<< "        if (abs(gl_in[ndx].gl_Position.y - aabb.w) < equalThreshold)\n"
			<< "            ++numVerticesOnBottomEdge;\n"
			<< "    bool isBottomTriangle = numVerticesOnBottomEdge == 2;\n"
			<< "\n";

		if (m_flags & FLAG_GEOMETRY_SCATTER_PRIMITIVES)
		{
			// scatter primitives
			src << "    // Draw grid cells\n"
				<< "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
				<< "    for (int ndx = 0; ndx < " << numPrimitives << "; ++ndx)\n"
				<< "    {\n"
				<< "        ivec2 dstGridSize = ivec2(" << m_tessGenLevel << " * " << numPrimitives << ", 2 * " << m_tessGenLevel << " * " << numInvocations << ");\n"
				<< "        ivec2 dstGridNdx = ivec2(" << m_tessGenLevel << " * ndx + gridPosition.x, " << m_tessGenLevel << " * inputTriangleNdx + 2 * gridPosition.y + ndx * 127) % dstGridSize;\n"
				<< "        vec4 dstArea;\n"
				<< "        dstArea.x = float(dstGridNdx.x)   / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.y = float(dstGridNdx.y)   / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
				<< "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
				<< "\n"
				<< "        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "        EndPrimitive();\n"
				<< "    }\n";
		}
		else if (m_flags & FLAG_GEOMETRY_SCATTER_LAYERS)
		{
			// Number of subrectangle instances = num layers
			DE_ASSERT(m_numLayers == numInvocations * 2);

			src << "    // Draw grid cells, send each primitive to a separate layer\n"
				<< "    int baseLayer = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
				<< "    for (int ndx = 0; ndx < " << numPrimitives << "; ++ndx)\n"
				<< "    {\n"
				<< "        ivec2 dstGridSize = ivec2(" << m_tessGenLevel << " * " << numPrimitives << ", " << m_tessGenLevel << ");\n"
				<< "        ivec2 dstGridNdx = ivec2((gridPosition.x * " << numPrimitives << " * 7 + ndx)*13, (gridPosition.y * 127 + ndx) * 19) % dstGridSize;\n"
				<< "        vec4 dstArea;\n"
				<< "        dstArea.x = float(dstGridNdx.x) / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.y = float(dstGridNdx.y) / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
				<< "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
				<< "\n"
				<< "        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "        EndPrimitive();\n"
				<< "    }\n";
		}
		else
		{
			if (m_flags & FLAG_GEOMETRY_SCATTER_INSTANCES)
			{
				src << "    // Scatter slices\n"
					<< "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
					<< "    ivec2 srcSliceNdx = ivec2(gridPosition.x, gridPosition.y * " << (numInvocations*2) << " + inputTriangleNdx);\n"
					<< "    ivec2 dstSliceNdx = ivec2(7 * srcSliceNdx.x, 127 * srcSliceNdx.y) % ivec2(" << m_tessGenLevel << ", " << m_tessGenLevel << " * " << (numInvocations*2) << ");\n"
					<< "\n"
					<< "    // Draw slice to the dstSlice slot\n"
					<< "    vec4 outputSliceArea;\n"
					<< "    outputSliceArea.x = float(dstSliceNdx.x)   / float(" << m_tessGenLevel << ") * 2.0 - 1.0 - gapOffset;\n"
					<< "    outputSliceArea.y = float(dstSliceNdx.y)   / float(" << (m_tessGenLevel * numInvocations * 2) << ") * 2.0 - 1.0 - gapOffset;\n"
					<< "    outputSliceArea.z = float(dstSliceNdx.x+1) / float(" << m_tessGenLevel << ") * 2.0 - 1.0 + gapOffset;\n"
					<< "    outputSliceArea.w = float(dstSliceNdx.y+1) / float(" << (m_tessGenLevel * numInvocations * 2) << ") * 2.0 - 1.0 + gapOffset;\n";
			}
			else
			{
				src << "    // Fill the input area with slices\n"
					<< "    // Upper triangle produces slices only to the upper half of the quad and vice-versa\n"
					<< "    float triangleOffset = (isBottomTriangle) ? ((aabb.w + aabb.y) / 2.0) : (aabb.y);\n"
					<< "    // Each slice is a invocation\n"
					<< "    float sliceHeight = (aabb.w - aabb.y) / float(2 * " << numInvocations << ");\n"
					<< "    float invocationOffset = float(gl_InvocationID) * sliceHeight;\n"
					<< "\n"
					<< "    vec4 outputSliceArea;\n"
					<< "    outputSliceArea.x = aabb.x - gapOffset;\n"
					<< "    outputSliceArea.y = triangleOffset + invocationOffset - gapOffset;\n"
					<< "    outputSliceArea.z = aabb.z + gapOffset;\n"
					<< "    outputSliceArea.w = triangleOffset + invocationOffset + sliceHeight + gapOffset;\n";
			}

			src << "\n"
				<< "    // Draw slice\n"
				<< "    for (int ndx = 0; ndx < " << ((numPrimitives+2)/2) << "; ++ndx)\n"
				<< "    {\n"
				<< "        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 outputColor = (((gl_InvocationID + ndx) % 2) == 0) ? (green) : (yellow);\n"
				<< "        float xpos = mix(outputSliceArea.x, outputSliceArea.z, float(ndx) / float(" << (numPrimitives/2) << "));\n"
				<< "\n"
				<< "        gl_Position = vec4(xpos, outputSliceArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(xpos, outputSliceArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "    }\n";
		}

		src <<	"}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}
}